

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O0

serialData * __thiscall MinVR::VRDataQueue::serialize_abi_cxx11_(VRDataQueue *this)

{
  bool bVar1;
  _Setw _Var2;
  size_type sVar3;
  pointer ppVar4;
  ostream *poVar5;
  VRDataQueueItem *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  serialData *in_RDI;
  ostringstream timeStamp;
  iterator it;
  ostringstream lenStr;
  serialData *out;
  ostream *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  serialData *__rhs;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  int local_388;
  char local_381;
  ostringstream local_380 [376];
  _Self local_208;
  _Self local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [35];
  undefined1 local_195;
  ostringstream local_188 [392];
  
  __rhs = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  sVar3 = std::
          map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
          ::size((map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                  *)0x15119d);
  std::ostream::operator<<(local_188,sVar3);
  local_195 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::ostringstream::str();
  std::operator+((char *)in_stack_fffffffffffffb78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::operator+(in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::operator=((string *)in_RDI,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
       ::begin((map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                *)in_stack_fffffffffffffb68);
  while( true ) {
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
         ::end((map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                *)in_stack_fffffffffffffb68);
    bVar1 = std::operator!=(&local_200,&local_208);
    if (!bVar1) break;
    std::__cxx11::ostringstream::ostringstream(local_380);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                           *)0x1512a8);
    poVar5 = (ostream *)std::ostream::operator<<(local_380,(ppVar4->first).first);
    poVar5 = std::operator<<(poVar5,"-");
    local_381 = (char)std::setfill<char>('0');
    this_00 = (VRDataQueueItem *)std::operator<<(poVar5,local_381);
    _Var2 = std::setw(3);
    local_388 = _Var2._M_n;
    in_stack_fffffffffffffb68 = std::operator<<((ostream *)this_00,_Var2);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                           *)0x15134a);
    std::ostream::operator<<(in_stack_fffffffffffffb68,(ppVar4->first).second);
    std::__cxx11::ostringstream::str();
    std::operator+((char *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(_Var2._M_n,in_stack_fffffffffffffb70));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char *)CONCAT44(_Var2._M_n,in_stack_fffffffffffffb70));
    std::_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>::
    operator->((_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                *)0x1513b2);
    VRDataQueueItem::serialize_abi_cxx11_(this_00);
    std::operator+(in_RSI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char *)CONCAT44(_Var2._M_n,in_stack_fffffffffffffb70));
    std::__cxx11::string::operator+=((string *)in_RDI,local_3a8);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream(local_380);
    std::_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>::
    operator++((_Rb_tree_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                *)CONCAT44(_Var2._M_n,in_stack_fffffffffffffb70));
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"</VRDataQueue>");
  local_195 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __rhs;
}

Assistant:

VRDataQueue::serialData VRDataQueue::serialize() {

  std::ostringstream lenStr;
  lenStr << _dataMap.size();

  VRDataQueue::serialData out;

  out = "<VRDataQueue num=\"" + lenStr.str() + "\">";
  for (VRDataList::iterator it = _dataMap.begin(); it != _dataMap.end(); ++it) {
    std::ostringstream timeStamp;
    timeStamp << it->first.first << "-" << std::setfill('0') << std::setw(3) << it->first.second;
    out += "<VRDataQueueItem timeStamp=\"" + timeStamp.str() + "\">" +
      it->second.serialize() + "</VRDataQueueItem>";
  }
  out += "</VRDataQueue>";

  return out;
}